

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

TProb<double> * __thiscall libDAI::TProb<double>::operator/=(TProb<double> *this,TProb<double> *q)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  pdVar2 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    pdVar3 = (q->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      dVar1 = pdVar3[lVar5];
      dVar6 = 0.0;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar6 = pdVar2[lVar5] / dVar1;
      }
      pdVar2[lVar5] = dVar6;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return this;
}

Assistant:

TProb<T>& operator/= (const TProb<T> & q) {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                for( size_t i = 0; i < size(); i++ ) {
#ifdef DEBUG
    //              assert( q[i] != 0.0 );
#endif
                    if( q[i] == 0.0 )       // FIXME
                        _p[i] = 0.0;
                    else
                        _p[i] /= q[i];
                }
                return *this;
            }